

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_tests.cpp
# Opt level: O3

double plus_by_inplace(ChebyshevExpansion *ce,ChebyshevExpansion *ce2,int N)

{
  vectype *pvVar1;
  long lVar2;
  
  if (N != 0) {
    lVar2 = (long)N;
    do {
      ChebTools::ChebyshevExpansion::operator+=(ce,ce2);
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  pvVar1 = ChebTools::ChebyshevExpansion::coef(ce);
  if (0 < (pvVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows)
  {
    return *(pvVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_data;
  }
  __assert_fail("index >= 0 && index < size()",
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                ,0xb5,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
               );
}

Assistant:

double plus_by_inplace(ChebyshevExpansion &ce, const ChebyshevExpansion &ce2, int N) {
    for (std::size_t i = 0; i < N; ++i) {
        ce += ce2;
    }
    return ce.coef()(0);
}